

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall
Js::GlobalObject::SetProperty
          (GlobalObject *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *this_00;
  BOOL local_3c;
  PropertyAttributes attributes;
  PropertyValueInfo *pPStack_38;
  BOOL setAttempted;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  GlobalObject *pGStack_18;
  PropertyId propertyId_local;
  GlobalObject *this_local;
  
  pPStack_38 = info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local._4_4_ = propertyId;
  pGStack_18 = this;
  if ((flags & PropertyOperation_Root) != PropertyOperation_None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x7ab,"(!(flags & PropertyOperation_Root))",
                                "!(flags & PropertyOperation_Root)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_3c = 1;
  BVar3 = SetExistingProperty(this,value_local._4_4_,pvStack_28,pPStack_38,&local_3c);
  if (BVar3 == 0) {
    if (local_3c == 0) {
      this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      ScriptContext::InvalidateProtoCaches(this_00,value_local._4_4_);
      this_local._4_4_ =
           DynamicObject::SetPropertyWithAttributes
                     ((DynamicObject *)this,value_local._4_4_,pvStack_28,'\a',pPStack_38,
                      PropertyOperation_None,SideEffects_Any);
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL GlobalObject::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(!(flags & PropertyOperation_Root));

        BOOL setAttempted = TRUE;
        if (this->SetExistingProperty(propertyId, value, info, &setAttempted))
        {
            return TRUE;
        }

        //
        // Set was attempted. But the set operation returned false.
        // This happens, when the property is read only.
        // In those scenarios, we should be setting the property with default attributes
        //
        if (setAttempted)
        {
            return FALSE;
        }

        // Windows 8 430092: When we set a new property on globalObject there may be stale inline caches holding onto directHostObject->prototype
        // properties of the same name. So we need to clear proto caches in this scenario. But check for same property in directHostObject->prototype
        // chain is expensive (call to DOM) compared to just invalidating the cache.
        // If this blind invalidation is expensive in any scenario then we need to revisit this.
        // Another solution proposed was not to cache any of the properties of window->directHostObject->prototype.
        // if ((this->directHostObject && JavascriptOperators::HasProperty(this->directHostObject->GetPrototype(), propertyId)) ||
        //    (this->hostObject && JavascriptOperators::HasProperty(this->hostObject->GetPrototype(), propertyId)))

        this->GetScriptContext()->InvalidateProtoCaches(propertyId);

        //
        // x = 10; implicit/phantom variable at global scope
        // These CAN be deleted
        // In ES5 they are enumerable.

        PropertyAttributes attributes = PropertyDynamicTypeDefaults;
        return DynamicObject::SetPropertyWithAttributes(propertyId, value, attributes, info);
    }